

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

bool __thiscall cmGlobalGenerator::UseFolderProperty(cmGlobalGenerator *this)

{
  cmState *this_00;
  pointer puVar1;
  bool bVar2;
  PolicyStatus PVar3;
  cmValue cVar4;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *pcVar5;
  string_view value;
  string local_40;
  
  this_00 = (this->CMakeInstance->State)._M_t.
            super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
            super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
            super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"USE_FOLDERS","");
  cVar4 = cmState::GetGlobalProperty(this_00,&local_40);
  pcVar5 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    pcVar5 = extraout_RDX_00;
  }
  if (cVar4.Value == (string *)0x0) {
    puVar1 = (this->Makefiles).
             super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (puVar1 == (this->Makefiles).
                  super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      __assert_fail("!this->Makefiles.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmGlobalGenerator.cxx"
                    ,0xc20,"virtual bool cmGlobalGenerator::UseFolderProperty() const");
    }
    PVar3 = cmMakefile::GetPolicyStatus
                      ((puVar1->_M_t).
                       super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
                       super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
                       super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,CMP0143,false);
    bVar2 = PVar3 == NEW;
  }
  else {
    value._M_str = pcVar5;
    value._M_len = (size_t)((cVar4.Value)->_M_dataplus)._M_p;
    bVar2 = cmValue::IsOn((cmValue *)(cVar4.Value)->_M_string_length,value);
  }
  return bVar2;
}

Assistant:

bool cmGlobalGenerator::UseFolderProperty() const
{
  const cmValue prop =
    this->GetCMakeInstance()->GetState()->GetGlobalProperty("USE_FOLDERS");

  // If this property is defined, let the setter turn this on or off.
  if (prop) {
    return prop.IsOn();
  }

  // If CMP0143 is NEW `treat` "USE_FOLDERS" as ON. Otherwise `treat` it as OFF
  assert(!this->Makefiles.empty());
  return (this->Makefiles[0]->GetPolicyStatus(cmPolicies::CMP0143) ==
          cmPolicies::NEW);
}